

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int fits_strcasecmp(char *s1,char *s2)

{
  char cVar1;
  int iVar2;
  char *in_RSI;
  char *in_RDI;
  char c2;
  char c1;
  char *local_18;
  char *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    iVar2 = toupper((int)*local_10);
    cVar1 = (char)iVar2;
    iVar2 = toupper((int)*local_18);
    if (cVar1 < (char)iVar2) {
      return -1;
    }
    if ((char)iVar2 < cVar1) break;
    if (cVar1 == '\0') {
      return 0;
    }
    local_10 = local_10 + 1;
    local_18 = local_18 + 1;
  }
  return 1;
}

Assistant:

int fits_strcasecmp(const char *s1, const char *s2)
{
   char c1, c2;

   for (;;) {
      c1 = toupper( *s1 );
      c2 = toupper( *s2 );

      if (c1 < c2) return(-1);
      if (c1 > c2) return(1);
      if (c1 == 0) return(0);
      s1++;
      s2++;
   }
}